

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O1

void av1_calc_proj_params_high_bd_c
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  if (params->r[0] < 1) {
LAB_00203543:
    if (params->r[1] < 1) {
      return;
    }
    if (0 < height) {
      lVar7 = (long)src8 * 2;
      lVar8 = (long)dat8 * 2;
      uVar5 = 0;
      do {
        if (0 < width) {
          uVar9 = 0;
          do {
            uVar1 = *(ushort *)(lVar8 + uVar9 * 2);
            uVar2 = *(ushort *)(lVar7 + uVar9 * 2);
            lVar4 = (long)flt1[uVar9] + (ulong)uVar1 * -0x10;
            H[1][1] = H[1][1] + lVar4 * lVar4;
            C[1] = C[1] + ((ulong)uVar2 - (ulong)uVar1) * lVar4 * 0x10;
            uVar9 = uVar9 + 1;
          } while ((uint)width != uVar9);
        }
        uVar5 = uVar5 + 1;
        flt1 = flt1 + flt1_stride;
        lVar7 = lVar7 + (long)src_stride * 2;
        lVar8 = lVar8 + (long)dat_stride * 2;
      } while (uVar5 != (uint)height);
    }
    lVar8 = (long)(height * width);
    H[1][1] = H[1][1] / lVar8;
  }
  else {
    if (params->r[1] < 1) {
      if (0 < params->r[0]) {
        if (0 < height) {
          lVar7 = (long)src8 * 2;
          lVar8 = (long)dat8 * 2;
          uVar5 = 0;
          do {
            if (0 < width) {
              uVar9 = 0;
              do {
                uVar1 = *(ushort *)(lVar8 + uVar9 * 2);
                uVar2 = *(ushort *)(lVar7 + uVar9 * 2);
                lVar4 = (long)flt0[uVar9] + (ulong)uVar1 * -0x10;
                (*H)[0] = (*H)[0] + lVar4 * lVar4;
                *C = *C + ((ulong)uVar2 - (ulong)uVar1) * lVar4 * 0x10;
                uVar9 = uVar9 + 1;
              } while ((uint)width != uVar9);
            }
            uVar5 = uVar5 + 1;
            flt0 = flt0 + flt0_stride;
            lVar7 = lVar7 + (long)src_stride * 2;
            lVar8 = lVar8 + (long)dat_stride * 2;
          } while (uVar5 != (uint)height);
        }
        lVar8 = (long)(height * width);
        (*H)[0] = (*H)[0] / lVar8;
        goto LAB_002035e6;
      }
      goto LAB_00203543;
    }
    if (0 < height) {
      lVar7 = (long)src8 * 2;
      lVar8 = (long)dat8 * 2;
      uVar5 = 0;
      do {
        if (0 < width) {
          uVar9 = 0;
          do {
            uVar1 = *(ushort *)(lVar8 + uVar9 * 2);
            uVar2 = *(ushort *)(lVar7 + uVar9 * 2);
            lVar10 = (long)flt0[uVar9] + (ulong)uVar1 * -0x10;
            iVar3 = flt1[uVar9];
            (*H)[0] = (*H)[0] + lVar10 * lVar10;
            lVar6 = ((ulong)uVar2 - (ulong)uVar1) * 0x10;
            lVar4 = (long)iVar3 + (ulong)uVar1 * -0x10;
            H[1][1] = H[1][1] + lVar4 * lVar4;
            (*H)[1] = (*H)[1] + lVar4 * lVar10;
            *C = *C + lVar10 * lVar6;
            C[1] = C[1] + lVar4 * lVar6;
            uVar9 = uVar9 + 1;
          } while ((uint)width != uVar9);
        }
        uVar5 = uVar5 + 1;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        lVar7 = lVar7 + (long)src_stride * 2;
        lVar8 = lVar8 + (long)dat_stride * 2;
      } while (uVar5 != (uint)height);
    }
    lVar8 = (long)(height * width);
    lVar7 = (*H)[1];
    (*H)[0] = (*H)[0] / lVar8;
    lVar7 = lVar7 / lVar8;
    (*H)[1] = lVar7;
    H[1][1] = H[1][1] / lVar8;
    H[1][0] = lVar7;
    *C = *C / lVar8;
  }
  C = C + 1;
LAB_002035e6:
  *C = *C / lVar8;
  return;
}

Assistant:

void av1_calc_proj_params_high_bd_c(const uint8_t *src8, int width, int height,
                                    int src_stride, const uint8_t *dat8,
                                    int dat_stride, int32_t *flt0,
                                    int flt0_stride, int32_t *flt1,
                                    int flt1_stride, int64_t H[2][2],
                                    int64_t C[2],
                                    const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_high_bd_c(src8, width, height, src_stride, dat8,
                                     dat_stride, flt0, flt0_stride, flt1,
                                     flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_high_bd_c(src8, width, height, src_stride, dat8,
                                  dat_stride, flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_high_bd_c(src8, width, height, src_stride, dat8,
                                  dat_stride, flt1, flt1_stride, H, C);
  }
}